

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

void __thiscall PDFHummus::DocumentContext::~DocumentContext(DocumentContext *this)

{
  DocumentContext *this_local;
  
  Cleanup(this);
  ExtGStateRegistry::~ExtGStateRegistry(&this->mExtGStateRegistry);
  EncryptionHelper::~EncryptionHelper(&this->mEncryptionHelper);
  std::
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_PDFHummus::HummusImageInformation,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_PDFHummus::HummusImageInformation>_>_>
  ::~map(&this->mImagesInformation);
  std::
  map<PDFTiledPattern_*,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>,_std::less<PDFTiledPattern_*>,_std::allocator<std::pair<PDFTiledPattern_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
  ::~map(&this->mMoreTiledPatternEndTasks);
  std::
  map<PDFPage_*,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>,_std::less<PDFPage_*>,_std::allocator<std::pair<PDFPage_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
  ::~map(&this->mMorePageEndTasks);
  std::
  map<PDFFormXObject_*,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IObjectEndWritingTask_*,_std::allocator<IObjectEndWritingTask_*>_>_>_>_>
  ::~map(&this->mMoreFormEndTasks);
  std::
  map<PDFTiledPattern_*,_std::__cxx11::list<ITiledPatternEndWritingTask_*,_std::allocator<ITiledPatternEndWritingTask_*>_>,_std::less<PDFTiledPattern_*>,_std::allocator<std::pair<PDFTiledPattern_*const,_std::__cxx11::list<ITiledPatternEndWritingTask_*,_std::allocator<ITiledPatternEndWritingTask_*>_>_>_>_>
  ::~map(&this->mTiledPatternEndTasks);
  std::
  map<PDFPage_*,_std::__cxx11::list<IPageEndWritingTask_*,_std::allocator<IPageEndWritingTask_*>_>,_std::less<PDFPage_*>,_std::allocator<std::pair<PDFPage_*const,_std::__cxx11::list<IPageEndWritingTask_*,_std::allocator<IPageEndWritingTask_*>_>_>_>_>
  ::~map(&this->mPageEndTasks);
  std::
  map<PDFFormXObject_*,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>,_std::less<PDFFormXObject_*>,_std::allocator<std::pair<PDFFormXObject_*const,_std::__cxx11::list<IFormEndWritingTask_*,_std::allocator<IFormEndWritingTask_*>_>_>_>_>
  ::~map(&this->mFormEndTasks);
  std::
  map<std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::list<IResourceWritingTask_*,_std::allocator<IResourceWritingTask_*>_>,_std::less<std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<ResourcesDictionary_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::list<IResourceWritingTask_*,_std::allocator<IResourceWritingTask_*>_>_>_>_>
  ::~map(&this->mResourcesTasks);
  std::__cxx11::string::~string((string *)&this->mNewPDFID);
  std::__cxx11::string::~string((string *)&this->mModifiedDocumentID);
  std::
  set<PDFDocumentCopyingContext_*,_std::less<PDFDocumentCopyingContext_*>,_std::allocator<PDFDocumentCopyingContext_*>_>
  ::~set(&this->mCopyingContexts);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            (&this->mAnnotations);
  UsedFontsRepository::~UsedFontsRepository(&this->mUsedFontsRepository);
  PDFDocumentHandler::~PDFDocumentHandler(&this->mPDFDocumentHandler);
  PNGImageHandler::~PNGImageHandler(&this->mPNGImageHandler);
  TIFFImageHandler::~TIFFImageHandler(&this->mTIFFImageHandler);
  JPEGImageHandler::~JPEGImageHandler(&this->mJPEGImageHandler);
  std::
  set<IDocumentContextExtender_*,_std::less<IDocumentContextExtender_*>,_std::allocator<IDocumentContextExtender_*>_>
  ::~set(&this->mExtenders);
  std::__cxx11::string::~string((string *)&this->mOutputFilePath);
  CatalogInformation::~CatalogInformation(&this->mCatalogInformation);
  TrailerInformation::~TrailerInformation(&this->mTrailerInformation);
  return;
}

Assistant:

DocumentContext::~DocumentContext(void)
{
    Cleanup();
}